

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void restoreCursor(_GLFWwindow *window)

{
  Window WVar1;
  
  XUngrabPointer(_glfw.x11.display,0);
  WVar1 = (window->x11).handle;
  if (window->cursor != (_GLFWcursor *)0x0) {
    XDefineCursor(_glfw.x11.display,WVar1,(window->cursor->x11).handle);
    return;
  }
  XUndefineCursor(_glfw.x11.display,WVar1);
  return;
}

Assistant:

static void restoreCursor(_GLFWwindow* window)
{
    XUngrabPointer(_glfw.x11.display, CurrentTime);

    if (window->cursor)
    {
        XDefineCursor(_glfw.x11.display, window->x11.handle,
                      window->cursor->x11.handle);
    }
    else
        XUndefineCursor(_glfw.x11.display, window->x11.handle);
}